

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

bool __thiscall
testing::internal::CartesianProductGenerator<int,_bool>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_>::AtEnd
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this)

{
  bool bVar1;
  
  bVar1 = ParamIterator<int>::operator==
                    (&(this->current_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<bool>_>
                      .super__Head_base<0UL,_testing::internal::ParamIterator<int>,_false>.
                      _M_head_impl,
                     &(this->end_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<bool>_>
                      .super__Head_base<0UL,_testing::internal::ParamIterator<int>,_false>.
                      _M_head_impl);
  if (bVar1) {
    return true;
  }
  bVar1 = ParamIterator<bool>::operator==
                    ((ParamIterator<bool> *)&this->current_,(ParamIterator<bool> *)&this->end_);
  return bVar1;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }